

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbAbc.c
# Opt level: O2

Acb_Ntk_t *
Acb_NtkFromNdr(char *pFileName,void *pModule,Abc_Nam_t *pNames,Vec_Int_t *vWeights,int nNameIdMax)

{
  int *piVar1;
  Vec_Int_t *p;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Acb_ObjType_t Type;
  uint uVar6;
  Abc_Nam_t *pAVar7;
  Acb_Man_t *p_00;
  Acb_Ntk_t *pNtk;
  Vec_Int_t *p_01;
  char *pcVar8;
  Abc_Nam_t *pAVar9;
  int **ppiVar10;
  Acb_Man_t *ppStart;
  Abc_Nam_t *pStrs;
  undefined4 in_register_00000084;
  Abc_Nam_t *pMods;
  Hash_IntMan_t *in_R9;
  int Count;
  int iVar11;
  int Obj_2;
  int Count_1;
  int nCos;
  int Obj;
  int iVar12;
  ulong uVar13;
  int *pArray;
  int local_48;
  int local_44;
  Vec_Int_t *local_40;
  char *local_38;
  
  pMods = (Abc_Nam_t *)CONCAT44(in_register_00000084,nNameIdMax);
  pAVar9 = (Abc_Nam_t *)vWeights;
  pAVar7 = Abc_NamRef(pNames);
  p_00 = Acb_ManAlloc(pFileName,(int)pAVar7,pStrs,pAVar9,pMods,in_R9);
  pAVar9 = p_00->pStrs;
  iVar11 = 0;
  iVar2 = Abc_NamStrFindOrAdd(pAVar9,p_00->pName,(int *)0x0);
  local_44 = Abc_NamStrFind(pAVar9,"1\'b0");
  iVar12 = 3;
  while( true ) {
    iVar3 = *(int *)(*(long *)((long)pModule + 0x10) + 8);
    if (iVar3 + 2 <= iVar12) break;
    iVar3 = Ndr_DataType((Ndr_Data_t *)pModule,iVar12);
    if (iVar3 == 3) {
      iVar3 = Ndr_ObjIsType((Ndr_Data_t *)pModule,iVar12,3);
      iVar11 = (iVar11 + 1) - (uint)(iVar3 == 0);
    }
    iVar3 = Ndr_DataSize((Ndr_Data_t *)pModule,iVar12);
    iVar12 = iVar12 + iVar3;
  }
  nCos = 0;
  local_40 = vWeights;
  for (iVar12 = 3; iVar12 < iVar3 + 2; iVar12 = iVar12 + iVar4) {
    iVar3 = Ndr_DataType((Ndr_Data_t *)pModule,iVar12);
    if (iVar3 == 3) {
      iVar3 = Ndr_ObjIsType((Ndr_Data_t *)pModule,iVar12,4);
      nCos = (nCos + 1) - (uint)(iVar3 == 0);
    }
    iVar4 = Ndr_DataSize((Ndr_Data_t *)pModule,iVar12);
    iVar3 = *(int *)(*(long *)((long)pModule + 0x10) + 8);
  }
  iVar4 = 0;
  for (iVar12 = 3; iVar12 < iVar3 + 2; iVar12 = iVar12 + iVar5) {
    iVar3 = Ndr_DataType((Ndr_Data_t *)pModule,iVar12);
    iVar4 = iVar4 + (uint)(iVar3 == 3);
    iVar5 = Ndr_DataSize((Ndr_Data_t *)pModule,iVar12);
    iVar3 = *(int *)(*(long *)((long)pModule + 0x10) + 8);
  }
  pNtk = Acb_NtkAlloc(p_00,iVar2,iVar11,nCos,iVar4);
  p_01 = Vec_IntStart(nNameIdMax);
  Vec_IntFill(&pNtk->vObjWeight,(pNtk->vObjType).nCap,0);
  Vec_IntFill(&pNtk->vObjName,(pNtk->vObjType).nCap,0);
  p = local_40;
  iVar2 = 3;
  while( true ) {
    iVar12 = *(int *)(*(long *)((long)pModule + 0x10) + 8);
    iVar11 = iVar12 + 2;
    if (iVar11 <= iVar2) break;
    iVar12 = Ndr_DataType((Ndr_Data_t *)pModule,iVar2);
    if (iVar12 == 3) {
      iVar12 = Ndr_ObjIsType((Ndr_Data_t *)pModule,iVar2,3);
      if (iVar12 != 0) {
        iVar12 = Ndr_ObjReadBody((Ndr_Data_t *)pModule,iVar2,5);
        iVar3 = Acb_ObjAlloc(pNtk,ABC_OPER_CI,0,iVar11);
        Vec_IntWriteEntry(p_01,iVar12,iVar3);
        Acb_ObjSetName(pNtk,iVar3,iVar12);
        iVar11 = 1;
        if (p != (Vec_Int_t *)0x0) {
          iVar11 = Vec_IntEntry(p,iVar12);
        }
        Acb_ObjSetWeight(pNtk,iVar3,iVar11);
      }
    }
    iVar11 = Ndr_DataSize((Ndr_Data_t *)pModule,iVar2);
    iVar2 = iVar2 + iVar11;
  }
  for (iVar2 = 3; iVar2 < iVar12 + 2; iVar2 = iVar2 + iVar11) {
    iVar11 = Ndr_DataType((Ndr_Data_t *)pModule,iVar2);
    if (iVar11 == 10) {
      iVar11 = *(int *)(*(long *)((long)pModule + 0x10) + (long)iVar2 * 4);
      iVar12 = Acb_ObjAlloc(pNtk,ABC_OPER_CONST_F,0,iVar2);
      Vec_IntWriteEntry(p_01,iVar11,iVar12);
      Acb_ObjSetName(pNtk,iVar12,iVar11);
      Vec_IntPush(&pNtk->vTargets,iVar12);
    }
    iVar11 = Ndr_DataSize((Ndr_Data_t *)pModule,iVar2);
    iVar12 = *(int *)(*(long *)((long)pModule + 0x10) + 8);
  }
  iVar2 = 3;
  while( true ) {
    ppiVar10 = (int **)(ulong)(iVar12 + 2U);
    if ((int)(iVar12 + 2U) <= iVar2) break;
    iVar11 = Ndr_DataType((Ndr_Data_t *)pModule,iVar2);
    if (iVar11 == 3) {
      iVar11 = Ndr_ObjIsType((Ndr_Data_t *)pModule,iVar2,3);
      if (iVar11 == 0) {
        iVar11 = Ndr_ObjIsType((Ndr_Data_t *)pModule,iVar2,4);
        if (iVar11 == 0) {
          iVar11 = Ndr_ObjReadBody((Ndr_Data_t *)pModule,iVar2,5);
          iVar12 = Ndr_ObjReadArray((Ndr_Data_t *)pModule,iVar2,(int)&pArray,ppiVar10);
          iVar3 = (int)ppiVar10;
          Type = Ndr_ObjReadBody((Ndr_Data_t *)pModule,iVar2,6);
          iVar12 = Acb_ObjAlloc(pNtk,Type,iVar12,iVar3);
          Vec_IntWriteEntry(p_01,iVar11,iVar12);
          Acb_ObjSetName(pNtk,iVar12,iVar11);
        }
      }
    }
    iVar11 = Ndr_DataSize((Ndr_Data_t *)pModule,iVar2);
    iVar2 = iVar2 + iVar11;
    iVar12 = *(int *)(*(long *)((long)pModule + 0x10) + 8);
  }
  iVar2 = 3;
  while( true ) {
    ppiVar10 = (int **)(ulong)(iVar12 + 2U);
    if ((int)(iVar12 + 2U) <= iVar2) break;
    iVar11 = Ndr_DataType((Ndr_Data_t *)pModule,iVar2);
    if (iVar11 == 3) {
      iVar11 = Ndr_ObjIsType((Ndr_Data_t *)pModule,iVar2,3);
      if (iVar11 == 0) {
        iVar11 = Ndr_ObjIsType((Ndr_Data_t *)pModule,iVar2,4);
        if (iVar11 == 0) {
          iVar11 = Ndr_ObjReadBody((Ndr_Data_t *)pModule,iVar2,5);
          local_38 = Abc_NamStr(p_00->pStrs,iVar11);
          local_48 = iVar11;
          iVar11 = Vec_IntEntry(p_01,iVar11);
          uVar6 = Ndr_ObjReadArray((Ndr_Data_t *)pModule,iVar2,(int)&pArray,ppiVar10);
          piVar1 = pArray;
          if ((int)uVar6 < 1) {
            uVar6 = 0;
          }
          for (uVar13 = 0; uVar6 != uVar13; uVar13 = uVar13 + 1) {
            iVar12 = Vec_IntEntry(p_01,piVar1[uVar13]);
            if (iVar12 == 0) {
              printf("Cannot find fanin %d of node \"%s\".\n",uVar13 & 0xffffffff,local_38);
            }
            iVar12 = Vec_IntEntry(p_01,piVar1[uVar13]);
            Acb_ObjAddFanin(pNtk,iVar11,iVar12);
          }
          iVar12 = 1;
          if (local_40 != (Vec_Int_t *)0x0) {
            iVar12 = Vec_IntEntry(local_40,local_48);
          }
          Acb_ObjSetWeight(pNtk,iVar11,iVar12);
        }
      }
    }
    iVar11 = Ndr_DataSize((Ndr_Data_t *)pModule,iVar2);
    iVar2 = iVar2 + iVar11;
    iVar12 = *(int *)(*(long *)((long)pModule + 0x10) + 8);
  }
  iVar2 = 3;
  do {
    if (iVar12 + 2 <= iVar2) {
      Vec_IntFree(p_01);
      pNtk->nRegs = 0;
      Acb_NtkAdd(p_00,pNtk);
      return pNtk;
    }
    iVar11 = Ndr_DataType((Ndr_Data_t *)pModule,iVar2);
    if (iVar11 == 3) {
      iVar11 = Ndr_ObjIsType((Ndr_Data_t *)pModule,iVar2,4);
      if (iVar11 != 0) {
        iVar11 = Ndr_ObjReadBody((Ndr_Data_t *)pModule,iVar2,5);
        ppStart = p_00;
        pcVar8 = Abc_NamStr(p_00->pStrs,iVar11);
        iVar11 = Ndr_ObjReadArray((Ndr_Data_t *)pModule,iVar2,(int)&pArray,(int **)ppStart);
        if (iVar11 != 1) {
          __assert_fail("nArray == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbAbc.c"
                        ,0xdb,
                        "Acb_Ntk_t *Acb_NtkFromNdr(char *, void *, Abc_Nam_t *, Vec_Int_t *, int)");
        }
        iVar11 = Acb_ObjAlloc(pNtk,ABC_OPER_CO,1,(int)ppStart);
        piVar1 = pArray;
        iVar12 = Vec_IntEntry(p_01,*pArray);
        if (iVar12 == 0) {
          printf("Adding constant 0 driver to non-driven PO \"%s\".\n",pcVar8);
          Vec_IntWriteEntry(p_01,*piVar1,local_44);
        }
        iVar12 = Vec_IntEntry(p_01,*piVar1);
        Acb_ObjAddFanin(pNtk,iVar11,iVar12);
        Acb_ObjSetName(pNtk,iVar11,*piVar1);
      }
    }
    iVar11 = Ndr_DataSize((Ndr_Data_t *)pModule,iVar2);
    iVar2 = iVar2 + iVar11;
    iVar12 = *(int *)(*(long *)((long)pModule + 0x10) + 8);
  } while( true );
}

Assistant:

Acb_Ntk_t * Acb_NtkFromNdr( char * pFileName, void * pModule, Abc_Nam_t * pNames, Vec_Int_t * vWeights, int nNameIdMax )
{
    Ndr_Data_t * p   = (Ndr_Data_t *)pModule; 
    Acb_Man_t * pMan = Acb_ManAlloc( pFileName, 1, Abc_NamRef(pNames), NULL, NULL, NULL );
    int k, NameId = Abc_NamStrFindOrAdd( pMan->pStrs, pMan->pName, NULL );
    int Mod = 2, Obj, Type, nArray, * pArray, ObjId;
    int Token0 = Abc_NamStrFind( pMan->pStrs, "1\'b0" );
    Acb_Ntk_t * pNtk = Acb_NtkAlloc( pMan, NameId, Ndr_DataCiNum(p, Mod), Ndr_DataCoNum(p, Mod), Ndr_DataObjNum(p, Mod) );
    Vec_Int_t * vMap = Vec_IntStart( nNameIdMax );
    Acb_NtkCleanObjWeights( pNtk );
    Acb_NtkCleanObjNames( pNtk );
    Ndr_ModForEachPi( p, Mod, Obj )
    {
        NameId = Ndr_ObjReadBody( p, Obj, NDR_OUTPUT );
        ObjId  = Acb_ObjAlloc( pNtk, ABC_OPER_CI, 0, 0 );
        Vec_IntWriteEntry( vMap, NameId, ObjId );
        Acb_ObjSetName( pNtk, ObjId, NameId );
        Acb_ObjSetWeight( pNtk, ObjId, vWeights ? Vec_IntEntry(vWeights, NameId) : 1 );
    }
    Ndr_ModForEachTarget( p, Mod, Obj )
    {
        NameId = Ndr_DataEntry( p, Obj );
        ObjId  = Acb_ObjAlloc( pNtk, ABC_OPER_CONST_F, 0, 0 );
        Vec_IntWriteEntry( vMap, NameId, ObjId );
        Acb_ObjSetName( pNtk, ObjId, NameId );
        Vec_IntPush( &pNtk->vTargets, ObjId );
    }
    Ndr_ModForEachNode( p, Mod, Obj )
    {
        NameId = Ndr_ObjReadBody( p, Obj, NDR_OUTPUT );
        nArray = Ndr_ObjReadArray( p, Obj, NDR_INPUT, &pArray );
        Type   = Ndr_ObjReadBody( p, Obj, NDR_OPERTYPE );
        ObjId  = Acb_ObjAlloc( pNtk, (Acb_ObjType_t) Type, nArray, 0 );
        Vec_IntWriteEntry( vMap, NameId, ObjId );
        Acb_ObjSetName( pNtk, ObjId, NameId );
    }
    Ndr_ModForEachNode( p, Mod, Obj )
    {
        int NameId = Ndr_ObjReadBody( p, Obj, NDR_OUTPUT );
        char * pName = Abc_NamStr( pMan->pStrs, NameId );
        ObjId  = Vec_IntEntry( vMap, NameId );
        nArray = Ndr_ObjReadArray( p, Obj, NDR_INPUT, &pArray );
        for ( k = 0; k < nArray; k++ )
        {
            if ( Vec_IntEntry(vMap, pArray[k]) == 0 )
                printf( "Cannot find fanin %d of node \"%s\".\n", k, pName );
            Acb_ObjAddFanin( pNtk, ObjId, Vec_IntEntry(vMap, pArray[k]) );
        }
        Acb_ObjSetWeight( pNtk, ObjId, vWeights ? Vec_IntEntry(vWeights, NameId) : 1 );
    }
    Ndr_ModForEachPo( p, Mod, Obj )
    {
        int NameId = Ndr_ObjReadBody( p, Obj, NDR_OUTPUT );
        char * pName = Abc_NamStr( pMan->pStrs, NameId );
        nArray = Ndr_ObjReadArray( p, Obj, NDR_INPUT, &pArray );
        assert( nArray == 1 );
        ObjId  = Acb_ObjAlloc( pNtk, ABC_OPER_CO, 1, 0 );
        if ( Vec_IntEntry(vMap, pArray[0]) == 0 )
        {
            printf( "Adding constant 0 driver to non-driven PO \"%s\".\n", pName );
            Vec_IntWriteEntry( vMap, pArray[0], Token0 );
        }
        Acb_ObjAddFanin( pNtk, ObjId, Vec_IntEntry(vMap, pArray[0]) );
        Acb_ObjSetName( pNtk, ObjId, pArray[0] );
    }
    Vec_IntFree( vMap );
    Acb_NtkSetRegNum( pNtk, 0 );
    Acb_NtkAdd( pMan, pNtk );
    return pNtk;
}